

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

UText * utext_openCharacterIterator_63(UText *ut,CharacterIterator *ci,UErrorCode *status)

{
  UChar *pUVar1;
  UText *pUVar2;
  
  if (U_ZERO_ERROR < *status) {
    return (UText *)0x0;
  }
  if (ci->begin < 1) {
    pUVar2 = utext_setup_63(ut,0x40,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      pUVar2->pFuncs = &charIterFuncs;
      pUVar2->context = ci;
      pUVar2->providerProperties = 0;
      pUVar2->a = (long)ci->end;
      pUVar1 = (UChar *)pUVar2->pExtra;
      pUVar2->p = pUVar1;
      pUVar2->b = -1;
      pUVar2->c = -1;
      pUVar2->q = pUVar1 + 0x10;
      pUVar2->chunkContents = pUVar1;
      pUVar2->chunkNativeStart = -1;
      pUVar2->chunkOffset = 1;
      pUVar2->chunkLength = 0;
      pUVar2->chunkNativeLimit = 0;
      pUVar2->nativeIndexingLimit = 1;
    }
  }
  else {
    *status = U_UNSUPPORTED_ERROR;
    pUVar2 = (UText *)0x0;
  }
  return pUVar2;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }